

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_trunc.cpp
# Opt level: O0

interval_t
duckdb::DateTruncBinaryOperator::Operation<duckdb::string_t,duckdb::interval_t,duckdb::interval_t>
          (string_t specifier,interval_t date)

{
  DatePartSpecifier in_stack_000000b7;
  undefined1 in_stack_000000b8 [16];
  string_t *in_stack_ffffffffffffffa8;
  string local_50 [64];
  interval_t local_10;
  
  string_t::GetString_abi_cxx11_(in_stack_ffffffffffffffa8);
  duckdb::GetDatePartSpecifier(local_50);
  local_10 = TruncateElement<duckdb::interval_t,duckdb::interval_t>
                       (in_stack_000000b7,(interval_t)in_stack_000000b8);
  std::__cxx11::string::~string(local_50);
  return local_10;
}

Assistant:

static inline TR Operation(TA specifier, TB date) {
		return TruncateElement<TB, TR>(GetDatePartSpecifier(specifier.GetString()), date);
	}